

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powi.c
# Opt level: O2

float powif(float base,int exp)

{
  uint uVar1;
  int n;
  float x;
  float fVar2;
  
  if (exp == 0) {
    fVar2 = 1.0;
  }
  else {
    fVar2 = 1.0;
    if (exp < 0) {
      base = 1.0 / base;
    }
    uVar1 = -exp;
    if (0 < exp) {
      uVar1 = exp;
    }
    while( true ) {
      if ((uVar1 & 1) != 0) {
        fVar2 = fVar2 * base;
      }
      if (uVar1 < 2) break;
      uVar1 = uVar1 >> 1;
      base = base * base;
    }
  }
  return fVar2;
}

Assistant:

float powif(float base, int exp)
{
    float x = base;
    int n = exp;
    float pow = 1.0;

    if (n != 0)  {
        if (n < 0) {
            n = -n;
            x = 1 / x;
        }
        for ( ; ; ) {
            if (n & 01)
                pow *= x;
            if (n >>= 1)
                x *= x;
            else
                break;
        }
    }
    return pow;
}